

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

void ExampleHostProcessingLoop(void *inputBuffer,void *outputBuffer,void *userData)

{
  PaUtilBufferProcessor *in_RDX;
  void *in_RDI;
  unsigned_long framesProcessed;
  int callbackResult;
  PaStreamCallbackTimeInfo timeInfo;
  PaSkeletonStream *stream;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  PaUtilCpuLoadMeasurer *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  
  memset(&stack0xffffffffffffffc8,0,0x18);
  PaUtil_BeginCpuLoadMeasurement((PaUtilCpuLoadMeasurer *)0x11268c);
  PaUtil_BeginBufferProcessing
            ((PaUtilBufferProcessor *)&in_RDX->initialFramesInTempInputBuffer,
             (PaStreamCallbackTimeInfo *)&stack0xffffffffffffffc8,0);
  PaUtil_SetInputFrameCount((PaUtilBufferProcessor *)&in_RDX->initialFramesInTempInputBuffer,0);
  PaUtil_SetInterleavedInputChannels
            ((PaUtilBufferProcessor *)&in_RDX->initialFramesInTempInputBuffer,0,in_RDI,0);
  PaUtil_SetOutputFrameCount((PaUtilBufferProcessor *)&in_RDX->initialFramesInTempInputBuffer,0);
  PaUtil_SetInterleavedOutputChannels
            (in_RDX,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  PaUtil_EndBufferProcessing
            ((PaUtilBufferProcessor *)timeInfo.outputBufferDacTime,(int *)timeInfo.currentTime);
  PaUtil_EndCpuLoadMeasurement
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  return;
}

Assistant:

static void ExampleHostProcessingLoop( void *inputBuffer, void *outputBuffer, void *userData )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)userData;
    PaStreamCallbackTimeInfo timeInfo = {0,0,0}; /* IMPLEMENT ME */
    int callbackResult;
    unsigned long framesProcessed;
    
    PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );
    
    /*
        IMPLEMENT ME:
            - generate timing information
            - handle buffer slips
    */

    /*
        If you need to byte swap or shift inputBuffer to convert it into a
        portaudio format, do it here.
    */



    PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, 0 /* IMPLEMENT ME: pass underflow/overflow flags when necessary */ );

    /*
        depending on whether the host buffers are interleaved, non-interleaved
        or a mixture, you will want to call PaUtil_SetInterleaved*Channels(),
        PaUtil_SetNonInterleaved*Channel() or PaUtil_Set*Channel() here.
    */
    
    PaUtil_SetInputFrameCount( &stream->bufferProcessor, 0 /* default to host buffer size */ );
    PaUtil_SetInterleavedInputChannels( &stream->bufferProcessor,
            0, /* first channel of inputBuffer is channel 0 */
            inputBuffer,
            0 ); /* 0 - use inputChannelCount passed to init buffer processor */

    PaUtil_SetOutputFrameCount( &stream->bufferProcessor, 0 /* default to host buffer size */ );
    PaUtil_SetInterleavedOutputChannels( &stream->bufferProcessor,
            0, /* first channel of outputBuffer is channel 0 */
            outputBuffer,
            0 ); /* 0 - use outputChannelCount passed to init buffer processor */

    /* you must pass a valid value of callback result to PaUtil_EndBufferProcessing()
        in general you would pass paContinue for normal operation, and
        paComplete to drain the buffer processor's internal output buffer.
        You can check whether the buffer processor's output buffer is empty
        using PaUtil_IsBufferProcessorOuputEmpty( bufferProcessor )
    */
    callbackResult = paContinue;
    framesProcessed = PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );

    
    /*
        If you need to byte swap or shift outputBuffer to convert it to
        host format, do it here.
    */

    PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesProcessed );


    if( callbackResult == paContinue )
    {
        /* nothing special to do */
    }
    else if( callbackResult == paAbort )
    {
        /* IMPLEMENT ME - finish playback immediately  */

        /* once finished, call the finished callback */
        if( stream->streamRepresentation.streamFinishedCallback != 0 )
            stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
    else
    {
        /* User callback has asked us to stop with paComplete or other non-zero value */

        /* IMPLEMENT ME - finish playback once currently queued audio has completed  */

        /* once finished, call the finished callback */
        if( stream->streamRepresentation.streamFinishedCallback != 0 )
            stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
}